

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetTreeForNested
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  CheckFieldIndex(field,index);
  p_Var1 = (this->nested_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var3 = &(this->nested_)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var3->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var1 + 1) >= field) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(FieldDescriptor **)(p_Var1 + 1) < field];
    } while (p_Var1 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      if (field < *(FieldDescriptor **)(p_Var2 + 1)) {
        return (ParseInfoTree *)0x0;
      }
      if (index == -1) {
        index = 0;
      }
      if ((ulong)((long)p_Var2[1]._M_left - (long)p_Var2[1]._M_parent >> 3) <= (ulong)(long)index) {
        return (ParseInfoTree *)0x0;
      }
      return *(ParseInfoTree **)(&(p_Var2[1]._M_parent)->_M_color + (long)index * 2);
    }
  }
  return (ParseInfoTree *)0x0;
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::GetTreeForNested(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  auto it = nested_.find(field);
  if (it == nested_.end() || index >= it->second.size()) {
    return nullptr;
  }

  return it->second[index].get();
}